

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O3

void __thiscall
QtPrivate::QMovableArrayOps<QMimeMagicRuleMatcher>::emplace<QMimeMagicRuleMatcher_const&>
          (QMovableArrayOps<QMimeMagicRuleMatcher> *this,qsizetype i,QMimeMagicRuleMatcher *args)

{
  qsizetype *pqVar1;
  QMimeMagicRuleMatcher **ppQVar2;
  QMimeMagicRuleMatcher *pQVar3;
  Data *pDVar4;
  QMimeMagicRuleMatcher *pQVar5;
  Data *pDVar6;
  Data *pDVar7;
  long in_FS_OFFSET;
  bool bVar8;
  QArrayDataPointer<QMimeMagicRule> local_60;
  uint local_48;
  undefined4 uStack_44;
  Data *pDStack_40;
  char16_t *local_38;
  qsizetype qStack_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar4 = (this->super_QGenericArrayOps<QMimeMagicRuleMatcher>).
           super_QArrayDataPointer<QMimeMagicRuleMatcher>.d;
  if ((pDVar4 == (Data *)0x0) ||
     (1 < (__int_type_conflict)(pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>)) {
LAB_004b1e43:
    local_60.d = (args->m_list).d.d;
    local_60.ptr = (args->m_list).d.ptr;
    local_60.size = (args->m_list).d.size;
    if (local_60.d != (Data *)0x0) {
      LOCK();
      ((local_60.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_60.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    _local_48 = CONCAT44(0xaaaaaaaa,args->m_priority);
    pDStack_40 = (args->m_mimetype).d.d;
    local_38 = (args->m_mimetype).d.ptr;
    qStack_30 = (args->m_mimetype).d.size;
    if (pDStack_40 != (Data *)0x0) {
      LOCK();
      (pDStack_40->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           (pDStack_40->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    bVar8 = (this->super_QGenericArrayOps<QMimeMagicRuleMatcher>).
            super_QArrayDataPointer<QMimeMagicRuleMatcher>.size != 0;
    QArrayDataPointer<QMimeMagicRuleMatcher>::detachAndGrow
              ((QArrayDataPointer<QMimeMagicRuleMatcher> *)this,(uint)(i == 0 && bVar8),1,
               (QMimeMagicRuleMatcher **)0x0,(QArrayDataPointer<QMimeMagicRuleMatcher> *)0x0);
    pQVar5 = (this->super_QGenericArrayOps<QMimeMagicRuleMatcher>).
             super_QArrayDataPointer<QMimeMagicRuleMatcher>.ptr;
    if (i == 0 && bVar8) {
      pQVar5[-1].m_list.d.d = local_60.d;
      pQVar5[-1].m_list.d.ptr = local_60.ptr;
      pQVar5[-1].m_list.d.size = local_60.size;
      pQVar5[-1].m_priority = local_48;
      pQVar5[-1].m_mimetype.d.d = pDStack_40;
      pQVar5[-1].m_mimetype.d.ptr = local_38;
      pQVar5[-1].m_mimetype.d.size = qStack_30;
      (this->super_QGenericArrayOps<QMimeMagicRuleMatcher>).
      super_QArrayDataPointer<QMimeMagicRuleMatcher>.ptr = pQVar5 + -1;
    }
    else {
      pQVar3 = pQVar5 + i;
      memmove(pQVar3 + 1,pQVar5 + i,
              ((this->super_QGenericArrayOps<QMimeMagicRuleMatcher>).
               super_QArrayDataPointer<QMimeMagicRuleMatcher>.size - i) * 0x38);
      (pQVar3->m_list).d.d = local_60.d;
      (pQVar3->m_list).d.ptr = local_60.ptr;
      (pQVar3->m_list).d.size = local_60.size;
      pQVar3->m_priority = local_48;
      (pQVar3->m_mimetype).d.d = pDStack_40;
      (pQVar3->m_mimetype).d.ptr = local_38;
      (pQVar3->m_mimetype).d.size = qStack_30;
    }
    pqVar1 = &(this->super_QGenericArrayOps<QMimeMagicRuleMatcher>).
              super_QArrayDataPointer<QMimeMagicRuleMatcher>.size;
    *pqVar1 = *pqVar1 + 1;
    qStack_30 = 0;
    local_38 = (char16_t *)0x0;
    pDStack_40 = (Data *)0x0;
    local_60.size = 0;
    local_60.ptr = (QMimeMagicRule *)0x0;
    local_60.d = (Data *)0x0;
    QArrayDataPointer<QMimeMagicRule>::~QArrayDataPointer(&local_60);
  }
  else {
    if (((this->super_QGenericArrayOps<QMimeMagicRuleMatcher>).
         super_QArrayDataPointer<QMimeMagicRuleMatcher>.size == i) &&
       (pQVar5 = (this->super_QGenericArrayOps<QMimeMagicRuleMatcher>).
                 super_QArrayDataPointer<QMimeMagicRuleMatcher>.ptr,
       (pDVar4->super_QArrayData).alloc - i !=
       ((long)((long)pQVar5 -
              ((ulong)((long)&pDVar4[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0)) >> 3) *
       0x6db6db6db6db6db7)) {
      pDVar6 = (args->m_list).d.d;
      pQVar5[i].m_list.d.d = pDVar6;
      pQVar5[i].m_list.d.ptr = (args->m_list).d.ptr;
      pQVar5[i].m_list.d.size = (args->m_list).d.size;
      if (pDVar6 != (Data *)0x0) {
        LOCK();
        (pDVar6->super_QArrayData).ref_._q_value.super___atomic_base<int> =
             (__atomic_base<int>)
             ((__int_type_conflict)(pDVar6->super_QArrayData).ref_._q_value.super___atomic_base<int>
             + 1);
        UNLOCK();
      }
      pQVar5[i].m_priority = args->m_priority;
      pDVar7 = (args->m_mimetype).d.d;
      pQVar5[i].m_mimetype.d.d = pDVar7;
      pQVar5[i].m_mimetype.d.ptr = (args->m_mimetype).d.ptr;
      pQVar5[i].m_mimetype.d.size = (args->m_mimetype).d.size;
      if (pDVar7 != (Data *)0x0) {
        LOCK();
        (pDVar7->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar7->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
    }
    else {
      if ((i != 0) ||
         (pQVar5 = (this->super_QGenericArrayOps<QMimeMagicRuleMatcher>).
                   super_QArrayDataPointer<QMimeMagicRuleMatcher>.ptr,
         (QMimeMagicRuleMatcher *)
         ((ulong)((long)&pDVar4[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0) == pQVar5))
      goto LAB_004b1e43;
      pDVar6 = (args->m_list).d.d;
      pQVar5[-1].m_list.d.d = pDVar6;
      pQVar5[-1].m_list.d.ptr = (args->m_list).d.ptr;
      pQVar5[-1].m_list.d.size = (args->m_list).d.size;
      if (pDVar6 != (Data *)0x0) {
        LOCK();
        (pDVar6->super_QArrayData).ref_._q_value.super___atomic_base<int> =
             (__atomic_base<int>)
             ((__int_type_conflict)(pDVar6->super_QArrayData).ref_._q_value.super___atomic_base<int>
             + 1);
        UNLOCK();
      }
      pQVar5[-1].m_priority = args->m_priority;
      pDVar7 = (args->m_mimetype).d.d;
      pQVar5[-1].m_mimetype.d.d = pDVar7;
      pQVar5[-1].m_mimetype.d.ptr = (args->m_mimetype).d.ptr;
      pQVar5[-1].m_mimetype.d.size = (args->m_mimetype).d.size;
      if (pDVar7 != (Data *)0x0) {
        LOCK();
        (pDVar7->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar7->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      ppQVar2 = &(this->super_QGenericArrayOps<QMimeMagicRuleMatcher>).
                 super_QArrayDataPointer<QMimeMagicRuleMatcher>.ptr;
      *ppQVar2 = *ppQVar2 + -1;
    }
    pqVar1 = &(this->super_QGenericArrayOps<QMimeMagicRuleMatcher>).
              super_QArrayDataPointer<QMimeMagicRuleMatcher>.size;
    *pqVar1 = *pqVar1 + 1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_28) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);
        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this, i, 1).insertOne(std::move(tmp));
        }
    }